

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

void __thiscall wasm::Literal::Literal(Literal *this,LaneArray<8> *lanes)

{
  undefined2 uVar1;
  reference pvVar2;
  long lVar3;
  size_type __n;
  size_type sVar4;
  long lVar5;
  undefined1 auStack_78 [8];
  array<unsigned_char,_16UL> bytes;
  
  (this->type).id = 6;
  sVar4 = 0;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    getBits(lanes->_M_elems + lVar3,(uint8_t (*) [16])(bytes._M_elems + 8));
    uVar1 = bytes._M_elems._8_2_;
    __n = sVar4;
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 8) {
      pvVar2 = std::array<unsigned_char,_16UL>::at((array<unsigned_char,_16UL> *)auStack_78,__n);
      *pvVar2 = (value_type_conflict1)((ushort)uVar1 >> ((byte)lVar5 & 0x1f));
      __n = __n + 1;
    }
    sVar4 = sVar4 + 2;
  }
  (this->field_0).i64 = (int64_t)auStack_78;
  (this->field_0).func.super_IString.str._M_str = (char *)bytes._M_elems._0_8_;
  return;
}

Assistant:

Literal::Literal(const LaneArray<8>& lanes) : type(Type::v128) {
  extractBytes<uint16_t, 8>(v128, lanes);
}